

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void RGB24MirrorRow_C(uint8_t *src_rgb24,uint8_t *dst_rgb24,int width)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  
  if (0 < width) {
    puVar2 = src_rgb24 + ((ulong)(uint)(width * 3) - 1);
    do {
      uVar1 = *puVar2;
      *(undefined2 *)dst_rgb24 = *(undefined2 *)(puVar2 + -2);
      dst_rgb24[2] = uVar1;
      dst_rgb24 = dst_rgb24 + 3;
      puVar2 = puVar2 + -3;
      width = width + -1;
    } while (width != 0);
  }
  return;
}

Assistant:

void RGB24MirrorRow_C(const uint8_t* src_rgb24, uint8_t* dst_rgb24, int width) {
  int x;
  src_rgb24 += width * 3 - 3;
  for (x = 0; x < width; ++x) {
    uint8_t b = src_rgb24[0];
    uint8_t g = src_rgb24[1];
    uint8_t r = src_rgb24[2];
    dst_rgb24[0] = b;
    dst_rgb24[1] = g;
    dst_rgb24[2] = r;
    src_rgb24 -= 3;
    dst_rgb24 += 3;
  }
}